

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

int http_send_error(http_s *r,size_t error)

{
  long lVar1;
  FIOBJ name;
  int iVar2;
  size_t sVar3;
  FIOBJ value;
  uintptr_t status;
  char buffer [16];
  fio_str_info_s t;
  
  iVar2 = -1;
  if (r != (http_s *)0x0) {
    if ((r->private_data).out_headers != 0) {
      status = 500;
      if (0xfffffffffffffc7b < error - 1000) {
        status = error;
      }
      r->status = status;
      buffer[0] = '/';
      sVar3 = fio_ltoa(buffer + 1,status,'\n');
      builtin_strncpy(buffer + sVar3 + 1,".html",6);
      lVar1 = *(long *)((r->private_data).flag + 0x38);
      iVar2 = http_sendfile2(r,*(char **)(lVar1 + 0x28),*(size_t *)(lVar1 + 0x30),buffer,sVar3 + 6);
      name = HTTP_HEADER_CONTENT_TYPE;
      if (iVar2 != 0) {
        value = http_mimetype_find("txt",3);
        http_set_header(r,name,value);
        http_status2str(&t,status);
        http_send_body(r,t.data,t.len);
      }
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int http_send_error(http_s *r, size_t error) {
  if (!r || !r->private_data.out_headers) {
    return -1;
  }
  if (error < 100 || error >= 1000)
    error = 500;
  r->status = error;
  char buffer[16];
  buffer[0] = '/';
  size_t pos = 1 + fio_ltoa(buffer + 1, error, 10);
  buffer[pos++] = '.';
  buffer[pos++] = 'h';
  buffer[pos++] = 't';
  buffer[pos++] = 'm';
  buffer[pos++] = 'l';
  buffer[pos] = 0;
  if (http_sendfile2(r, http2protocol(r)->settings->public_folder,
                     http2protocol(r)->settings->public_folder_length, buffer,
                     pos)) {
    http_set_header(r, HTTP_HEADER_CONTENT_TYPE,
                    http_mimetype_find((char *)"txt", 3));
    fio_str_info_s t = http_status2str(error);
    http_send_body(r, t.data, t.len);
  }
  return 0;
}